

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ProgramAttachedShadersCase::test
          (ProgramAttachedShadersCase *this)

{
  CallLogWrapper *this_00;
  ostringstream *poVar1;
  TestContext *pTVar2;
  GLuint shader;
  GLuint shader_00;
  GLuint program;
  GLint count;
  GLuint shaders [2];
  GLsizei local_1bc;
  GLuint local_1b8 [2];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  shader = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  shader_00 = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
  glu::CallLogWrapper::glShaderSource
            (this_00,shader,1,&Functional::(anonymous_namespace)::commonTestVertSource,(GLint *)0x0)
  ;
  glu::CallLogWrapper::glShaderSource
            (this_00,shader_00,1,&Functional::(anonymous_namespace)::commonTestFragSource,
             (GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,shader);
  glu::CallLogWrapper::glCompileShader(this_00,shader_00);
  ApiCase::expectError(&this->super_ApiCase,0);
  program = glu::CallLogWrapper::glCreateProgram(this_00);
  verifyProgramParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,program,0x8b85,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glAttachShader(this_00,program,shader);
  verifyProgramParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,program,0x8b85,1);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glAttachShader(this_00,program,shader_00);
  verifyProgramParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,program,0x8b85,2);
  ApiCase::expectError(&this->super_ApiCase,0);
  local_1b8[0] = 0;
  local_1b8[1] = 0;
  local_1bc = 0;
  glu::CallLogWrapper::glGetAttachedShaders(this_00,program,2,&local_1bc,local_1b8);
  if (local_1bc != 2) {
    local_1b0._0_8_ =
         ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// ERROR: Expected 2; got ",0x1a);
    std::ostream::operator<<(poVar1,local_1bc);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    if (pTVar2->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_FAIL,"got wrong shader count");
    }
  }
  if (((local_1b8[0] != shader) || (local_1b8[1] != shader_00)) &&
     ((local_1b8[0] != shader_00 || (local_1b8[1] != shader)))) {
    local_1b0._0_8_ =
         ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// ERROR: Expected {",0x14);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"}; got {",8);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"}",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    if (pTVar2->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_FAIL,"got wrong shader count");
    }
  }
  local_1b8[0] = 0;
  local_1b8[1] = 0;
  local_1bc = 0;
  glu::CallLogWrapper::glGetAttachedShaders(this_00,program,0,&local_1bc,local_1b8);
  if (local_1bc != 0) {
    local_1b0._0_8_ =
         ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// ERROR: Expected 0; got ",0x1a);
    std::ostream::operator<<(poVar1,local_1bc);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    if (pTVar2->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_FAIL,"got wrong shader count");
    }
  }
  local_1bc = 0;
  glu::CallLogWrapper::glGetAttachedShaders(this_00,program,1,&local_1bc,local_1b8);
  if (local_1bc != 1) {
    local_1b0._0_8_ =
         ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// ERROR: Expected 1; got ",0x1a);
    std::ostream::operator<<(poVar1,local_1bc);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    if (pTVar2->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_FAIL,"got wrong shader count");
    }
  }
  glu::CallLogWrapper::glDeleteShader(this_00,shader);
  glu::CallLogWrapper::glDeleteShader(this_00,shader_00);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		GLuint shaderVert = glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag = glCreateShader(GL_FRAGMENT_SHADER);

		glShaderSource(shaderVert, 1, &commonTestVertSource, DE_NULL);
		glShaderSource(shaderFrag, 1, &commonTestFragSource, DE_NULL);

		glCompileShader(shaderVert);
		glCompileShader(shaderFrag);
		expectError(GL_NO_ERROR);

		// check ATTACHED_SHADERS

		GLuint program = glCreateProgram();
		verifyProgramParam(m_testCtx, *this, program, GL_ATTACHED_SHADERS, 0);
		expectError(GL_NO_ERROR);

		glAttachShader(program, shaderVert);
		verifyProgramParam(m_testCtx, *this, program, GL_ATTACHED_SHADERS, 1);
		expectError(GL_NO_ERROR);

		glAttachShader(program, shaderFrag);
		verifyProgramParam(m_testCtx, *this, program, GL_ATTACHED_SHADERS, 2);
		expectError(GL_NO_ERROR);

		// check GetAttachedShaders
		{
			GLuint shaders[2] = {0, 0};
			GLint count = 0;
			glGetAttachedShaders(program, DE_LENGTH_OF_ARRAY(shaders), &count, shaders);

			if (count != 2)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected 2; got " << count << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got wrong shader count");
			}
			// shaders are the attached shaders?
			if (!((shaders[0] == shaderVert && shaders[1] == shaderFrag) ||
				  (shaders[0] == shaderFrag && shaders[1] == shaderVert)))
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected {" << shaderVert << ", " << shaderFrag << "}; got {" << shaders[0] << ", " << shaders[1] << "}" << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got wrong shader count");
			}
		}

		// check GetAttachedShaders with too small buffer
		{
			GLuint shaders[2] = {0, 0};
			GLint count = 0;

			glGetAttachedShaders(program, 0, &count, shaders);
			if (count != 0)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected 0; got " << count << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got wrong shader count");
			}

			count = 0;
			glGetAttachedShaders(program, 1, &count, shaders);
			if (count != 1)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected 1; got " << count << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got wrong shader count");
			}
		}

		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		glDeleteProgram(program);
		expectError(GL_NO_ERROR);
	}